

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

bool __thiscall QHttpHeaders::append(QHttpHeaders *this,WellKnownHeader name,QAnyStringView value)

{
  QHttpHeadersPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  _Variadic_union<QHttpHeaders::WellKnownHeader,_QByteArray> local_68;
  undefined1 local_50;
  QByteArray local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isValidHttpHeaderValueField(value);
  if (bVar2) {
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::detach(&this->d);
    pQVar1 = (this->d).d.ptr;
    local_50 = 0;
    local_68._M_first._M_storage = (_Uninitialized<QHttpHeaders::WellKnownHeader,_true>)name;
    normalizedValue(&local_48,value);
    QList<Header>::emplaceBack<Header>(&pQVar1->headers,(Header *)&local_68._M_first);
    Header::~Header((Header *)&local_68._M_first);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpHeaders::append(WellKnownHeader name, QAnyStringView value)
{
    if (!isValidHttpHeaderValueField(value))
        return false;

    d.detach();
    d->headers.push_back({HeaderName{name}, normalizedValue(value)});
    return true;
}